

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QMdiSubWindow * __thiscall QMdiArea::currentSubWindow(QMdiArea *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QWidget *this_00;
  long lVar4;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (*(long *)(lVar1 + 0x368) != 0) {
    lVar2 = *(long *)(lVar1 + 0x388);
    if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) &&
       (*(QMdiSubWindow **)(lVar1 + 0x390) != (QMdiSubWindow *)0x0)) {
      if (*(int *)(lVar2 + 4) == 0) {
        return (QMdiSubWindow *)0x0;
      }
      return *(QMdiSubWindow **)(lVar1 + 0x390);
    }
    if (*(char *)(lVar1 + 0x3ca) == '\x01') {
      this_00 = QWidget::window((QWidget *)this);
      bVar3 = QWidget::isMinimized(this_00);
      if (!bVar3) {
        return (QMdiSubWindow *)0x0;
      }
    }
    lVar4 = (long)**(int **)(lVar1 + 0x378) * 0x10;
    lVar2 = *(long *)(*(long *)(lVar1 + 0x360) + lVar4);
    if ((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) {
      return *(QMdiSubWindow **)(*(long *)(lVar1 + 0x360) + lVar4 + 8);
    }
  }
  return (QMdiSubWindow *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }